

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

Statement * __thiscall soul::ModuleCloner::cloneStatement(ModuleCloner *this,Statement *s)

{
  bool bVar1;
  int iVar2;
  AssignFromValue *__fn;
  undefined4 extraout_var;
  FunctionCall *__fn_00;
  undefined4 extraout_var_00;
  ReadStream *__fn_01;
  undefined4 extraout_var_01;
  WriteStream *__fn_02;
  undefined4 extraout_var_02;
  AdvanceClock *__fn_03;
  undefined4 extraout_var_03;
  int in_ECX;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *__child_stack_02;
  void *__child_stack_03;
  void *in_R8;
  pool_ptr<const_soul::heart::AdvanceClock> local_58;
  pool_ptr<const_soul::heart::AdvanceClock> t_4;
  pool_ptr<const_soul::heart::WriteStream> t_3;
  pool_ptr<const_soul::heart::ReadStream> t_2;
  pool_ptr<const_soul::heart::FunctionCall> t_1;
  pool_ptr<const_soul::heart::AssignFromValue> local_28;
  pool_ptr<const_soul::heart::AssignFromValue> t;
  Statement *s_local;
  ModuleCloner *this_local;
  
  t.object = (AssignFromValue *)s;
  cast<soul::heart::AssignFromValue_const,soul::heart::Statement>((soul *)&local_28,s);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_28);
  if (bVar1) {
    __fn = pool_ptr<const_soul::heart::AssignFromValue>::operator*(&local_28);
    iVar2 = clone(this,(__fn *)__fn,__child_stack,in_ECX,in_R8);
    this_local = (ModuleCloner *)CONCAT44(extraout_var,iVar2);
  }
  pool_ptr<const_soul::heart::AssignFromValue>::~pool_ptr(&local_28);
  if (!bVar1) {
    cast<soul::heart::FunctionCall_const,soul::heart::Statement>((soul *)&t_2,(Statement *)t.object)
    ;
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&t_2);
    if (bVar1) {
      __fn_00 = pool_ptr<const_soul::heart::FunctionCall>::operator*
                          ((pool_ptr<const_soul::heart::FunctionCall> *)&t_2);
      iVar2 = clone(this,(__fn *)__fn_00,__child_stack_00,in_ECX,in_R8);
      this_local = (ModuleCloner *)CONCAT44(extraout_var_00,iVar2);
    }
    pool_ptr<const_soul::heart::FunctionCall>::~pool_ptr
              ((pool_ptr<const_soul::heart::FunctionCall> *)&t_2);
    if (!bVar1) {
      cast<soul::heart::ReadStream_const,soul::heart::Statement>((soul *)&t_3,(Statement *)t.object)
      ;
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&t_3);
      if (bVar1) {
        __fn_01 = pool_ptr<const_soul::heart::ReadStream>::operator*
                            ((pool_ptr<const_soul::heart::ReadStream> *)&t_3);
        iVar2 = clone(this,(__fn *)__fn_01,__child_stack_01,in_ECX,in_R8);
        this_local = (ModuleCloner *)CONCAT44(extraout_var_01,iVar2);
      }
      pool_ptr<const_soul::heart::ReadStream>::~pool_ptr
                ((pool_ptr<const_soul::heart::ReadStream> *)&t_3);
      if (!bVar1) {
        cast<soul::heart::WriteStream_const,soul::heart::Statement>
                  ((soul *)&t_4,(Statement *)t.object);
        bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&t_4);
        if (bVar1) {
          __fn_02 = pool_ptr<const_soul::heart::WriteStream>::operator*
                              ((pool_ptr<const_soul::heart::WriteStream> *)&t_4);
          iVar2 = clone(this,(__fn *)__fn_02,__child_stack_02,in_ECX,in_R8);
          this_local = (ModuleCloner *)CONCAT44(extraout_var_02,iVar2);
        }
        pool_ptr<const_soul::heart::WriteStream>::~pool_ptr
                  ((pool_ptr<const_soul::heart::WriteStream> *)&t_4);
        if (!bVar1) {
          cast<soul::heart::AdvanceClock_const,soul::heart::Statement>
                    ((soul *)&local_58,(Statement *)t.object);
          bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_58);
          if (bVar1) {
            __fn_03 = pool_ptr<const_soul::heart::AdvanceClock>::operator*(&local_58);
            iVar2 = clone(this,(__fn *)__fn_03,__child_stack_03,in_ECX,in_R8);
            this_local = (ModuleCloner *)CONCAT44(extraout_var_03,iVar2);
          }
          pool_ptr<const_soul::heart::AdvanceClock>::~pool_ptr(&local_58);
          if (!bVar1) {
            throwInternalCompilerError("cloneStatement",0x140);
          }
        }
      }
    }
  }
  return (Statement *)this_local;
}

Assistant:

heart::Statement& cloneStatement (heart::Statement& s)
    {
        #define SOUL_CLONE_STATEMENT(Type)     if (auto t = cast<const heart::Type> (s)) return clone (*t);
        SOUL_HEART_STATEMENTS (SOUL_CLONE_STATEMENT)
        #undef SOUL_CLONE_STATEMENT
        SOUL_ASSERT_FALSE;
        return s;
    }